

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int rawWaveAddGeneric(uint numIn1,rawWave_t *in1)

{
  rawWave_t *prVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  uint32_t *puVar25;
  bool bVar26;
  bool bVar27;
  ulong uVar13;
  
  uVar7 = (ulong)(uint)wfcur;
  uVar6 = wfc[uVar7];
  uVar11 = 1 - wfcur;
  uVar13 = (ulong)uVar11;
  if (numIn1 == 0 && uVar6 == 0) {
    bVar27 = true;
    uVar16 = 0;
    uVar17 = 0x416c;
    uVar24 = 0;
    uVar20 = 0;
  }
  else {
    lVar8 = uVar7 * 0x2ee00;
    lVar18 = uVar13 * 0x2ee00;
    uVar10 = -(uint)(uVar6 == 0);
    uVar9 = -(uint)(numIn1 == 0);
    puVar25 = &wf[uVar13][0].flags;
    uVar17 = 0x416c;
    iVar12 = 0;
    uVar21 = 0;
    uVar20 = 0;
    uVar22 = 0;
    uVar16 = 0;
    uVar15 = 0;
    do {
      iVar14 = (int)uVar15;
      uVar23 = uVar20;
      if (uVar9 < uVar10) {
        if (uVar20 < uVar9) {
          piVar2 = (int *)(lVar18 + 0x13b878 + (ulong)(iVar14 - 1) * 0x10);
          *piVar2 = *piVar2 + iVar12 + uVar9;
          uVar23 = uVar9;
        }
        uVar5 = in1[uVar21].gpioOff;
        ((rawWave_t *)(puVar25 + -3))->gpioOn = in1[uVar21].gpioOn;
        ((rawWave_t *)(puVar25 + -3))->gpioOff = uVar5;
        *puVar25 = in1[uVar21].flags;
        uVar9 = in1[uVar21].usDelay + uVar23;
        uVar21 = (ulong)((int)uVar21 + 1);
      }
      else {
        uVar24 = (ulong)uVar22;
        if (uVar10 < uVar9) {
          if (uVar20 < uVar10) {
            piVar2 = (int *)(lVar18 + 0x13b878 + (ulong)(iVar14 - 1) * 0x10);
            *piVar2 = *piVar2 + iVar12 + uVar10;
            uVar23 = uVar10;
          }
          prVar1 = wf[uVar7] + uVar24;
          uVar5 = prVar1->gpioOff;
          ((rawWave_t *)(puVar25 + -3))->gpioOn = prVar1->gpioOn;
          ((rawWave_t *)(puVar25 + -3))->gpioOff = uVar5;
          *puVar25 = *(uint *)(lVar8 + 0x13b87c + uVar24 * 0x10);
        }
        else {
          if (uVar20 < uVar9) {
            piVar2 = (int *)(lVar18 + 0x13b878 + (ulong)(iVar14 - 1) * 0x10);
            *piVar2 = *piVar2 + iVar12 + uVar9;
            uVar23 = uVar9;
          }
          prVar1 = wf[uVar7] + uVar24;
          uVar3._0_4_ = prVar1->gpioOn;
          uVar3._4_4_ = prVar1->gpioOff;
          uVar4._0_4_ = in1[uVar21].gpioOn;
          uVar4._4_4_ = in1[uVar21].gpioOff;
          ((rawWave_t *)(puVar25 + -3))->gpioOn = (int)(uVar3 | uVar4);
          ((rawWave_t *)(puVar25 + -3))->gpioOff = (int)((uVar3 | uVar4) >> 0x20);
          *puVar25 = *(uint *)(lVar8 + 0x13b87c + uVar24 * 0x10) | in1[uVar21].flags;
          uVar9 = in1[uVar21].usDelay + uVar23;
          uVar21 = (ulong)((int)uVar21 + 1);
        }
        uVar10 = *(int *)(lVar8 + 0x13b878 + uVar24 * 0x10) + uVar23;
        uVar22 = uVar22 + 1;
      }
      uVar20 = uVar10;
      if (uVar9 < uVar10) {
        uVar20 = uVar9;
      }
      iVar12 = 0;
      uVar23 = uVar20 - uVar23;
      puVar25[-1] = uVar23;
      if ((uVar23 != 0) && (iVar12 = 1, 6 < gpioCfg.DMAsecondaryChannel)) {
        iVar12 = ((uVar23 & 0x3fffffff) / 0x3fff + 1) - (uint)(uVar23 * -0x40010004 >> 2 < 0x10005);
      }
      uVar19 = *puVar25 & 1;
      uVar23 = *puVar25 & 2;
      uVar17 = ((int)(uVar23 << 0x1e) >> 0x1f) + (uVar17 - uVar19);
      uVar16 = (uVar23 >> 1) + uVar19 +
               ((((iVar12 + uVar16) - (uint)(((rawWave_t *)(puVar25 + -3))->gpioOn == 0)) + 2) -
               (uint)(puVar25[-2] == 0));
      uVar24 = uVar15 + 1;
      bVar26 = numIn1 <= (uint)uVar21;
      if (bVar26) {
        uVar9 = 0xffffffff;
      }
      if (uVar6 <= uVar22) {
        uVar10 = 0xffffffff;
      }
      bVar27 = uVar15 < 11999;
      if (uVar6 <= uVar22 && bVar26) break;
      iVar12 = -uVar20;
      puVar25 = puVar25 + 4;
      bVar26 = uVar15 < 11999;
      uVar15 = uVar24;
    } while (bVar26);
  }
  uVar6 = 0xffffffdc;
  if ((bVar27) && (uVar10 = (uint)uVar24, uVar10 < uVar17)) {
    if (wfStats_1 < uVar20) {
      wfStats_1 = uVar20;
    }
    if (wfStats_4 < uVar10) {
      wfStats_4 = uVar10;
    }
    if (wfStats_7 < uVar16) {
      wfStats_7 = uVar16;
    }
    wfStats_0 = uVar20;
    wfStats_3 = uVar10;
    wfStats_6 = uVar16;
    wfc[uVar13] = uVar10;
    uVar6 = uVar10;
    wfcur = uVar11;
  }
  return uVar6;
}

Assistant:

int rawWaveAddGeneric(unsigned numIn1, rawWave_t *in1)
{
   unsigned inPos1=0, inPos2=0, outPos=0, level = NUM_WAVE_OOL;

   unsigned cbs=0;

   unsigned numIn2, numOut;

   uint32_t tNow, tNext1, tNext2, tDelay;

   rawWave_t *in2, *out;

   numIn2 = wfc[wfcur];
   in2    = wf[wfcur];

   numOut = PI_WAVE_MAX_PULSES;
   out   = wf[1-wfcur];

   tNow = 0;

   if (!numIn1) tNext1 = -1; else tNext1 = 0;
   if (!numIn2) tNext2 = -1; else tNext2 = 0;

   while (((inPos1<numIn1) || (inPos2<numIn2)) && (outPos<numOut))
   {
      if (tNext1 < tNext2)
      {
         /* pulse 1 due */

         if (tNow < tNext1)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext1 - tNow);
            tNow = tNext1;
         }

         out[outPos].gpioOn  = in1[inPos1].gpioOn;
         out[outPos].gpioOff = in1[inPos1].gpioOff;
         out[outPos].flags   = in1[inPos1].flags;

         tNext1 = tNow + in1[inPos1].usDelay; ++inPos1;
      }
      else if (tNext2 < tNext1)
      {
         /* pulse 2 due */

         if (tNow < tNext2)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext2 - tNow);
            tNow = tNext2;
         }

         out[outPos].gpioOn  = in2[inPos2].gpioOn;
         out[outPos].gpioOff = in2[inPos2].gpioOff;
         out[outPos].flags   = in2[inPos2].flags;

         tNext2 = tNow + in2[inPos2].usDelay; ++inPos2;
      }
      else
      {
         /* pulse 1 and 2 both due */

         if (tNow < tNext1)
         {
            /* extend previous delay */
            out[outPos-1].usDelay += (tNext1 - tNow);
            tNow = tNext1;
         }

         out[outPos].gpioOn  = in1[inPos1].gpioOn  | in2[inPos2].gpioOn;
         out[outPos].gpioOff = in1[inPos1].gpioOff | in2[inPos2].gpioOff;
         out[outPos].flags   = in1[inPos1].flags   | in2[inPos2].flags;

         tNext1 = tNow + in1[inPos1].usDelay; ++inPos1;
         tNext2 = tNow + in2[inPos2].usDelay; ++inPos2;
      }

      if (tNext1 <= tNext2) { tDelay = tNext1 - tNow; tNow = tNext1; }
      else                  { tDelay = tNext2 - tNow; tNow = tNext2; }

      out[outPos].usDelay = tDelay;

      cbs += waveDelayCBs(tDelay);

      if (out[outPos].gpioOn) cbs++; /* one cb if gpio on */

      if (out[outPos].gpioOff) cbs++; /* one cb if gpio off */

      if (out[outPos].flags & WAVE_FLAG_READ)
      {
         cbs++; /* one cb if read */
         --level;
      }

      if (out[outPos].flags & WAVE_FLAG_TICK)
      {
         cbs++; /* one cb if tick */
         --level;
      }

      outPos++;

      if (inPos1 >= numIn1) tNext1 = -1;
      if (inPos2 >= numIn2) tNext2 = -1;

   }

   if ((outPos < numOut) && (outPos < level))
   {
      wfStats.micros = tNow;

      if (tNow > wfStats.highMicros) wfStats.highMicros = tNow;

      wfStats.pulses = outPos;

      if (outPos > wfStats.highPulses) wfStats.highPulses = outPos;

      wfStats.cbs    = cbs;

      if (cbs > wfStats.highCbs) wfStats.highCbs = cbs;

      wfc[1-wfcur] = outPos;
      wfcur = 1 - wfcur;

      return outPos;
   }
   else return PI_TOO_MANY_PULSES;
}